

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shell.cpp
# Opt level: O0

void anon_unknown.dwarf_5f2f::showHelp(void)

{
  std::operator<<((ostream *)&std::cerr,
                  "Shell -- interactive test program using Binlog\n\nReads commands from argv[1:] and standard input:\n\n  log w1 <msg>     Log <msg> using the first writer\n  log w2 <msg>     Log <msg> using the second writer\n  terminate        Forcefully terminate the application\n  help             Show this help\n\n"
                 );
  return;
}

Assistant:

void showHelp()
{
  std::cerr <<
    "Shell -- interactive test program using Binlog\n"
    "\n"
    "Reads commands from argv[1:] and standard input:\n"
    "\n"
    "  log w1 <msg>     Log <msg> using the first writer\n"
    "  log w2 <msg>     Log <msg> using the second writer\n"
    "  terminate        Forcefully terminate the application\n"
    "  help             Show this help\n"
    "\n"
    ;
}